

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrashX.cpp
# Opt level: O3

HighsStatus
callCrossover(HighsOptions *options,HighsLp *lp,HighsBasis *highs_basis,
             HighsSolution *highs_solution,HighsModelStatus *model_status,HighsInfo *highs_info,
             HighsCallback *highs_callback)

{
  HighsInt *pHVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Parameters new_parameters;
  Int IVar6;
  uint uVar7;
  HighsStatus HVar8;
  long lVar9;
  HighsLogOptions *log_options_;
  uint *puVar10;
  undefined8 *puVar11;
  pointer z_start;
  int iVar12;
  long lVar13;
  pointer y_start;
  byte bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  undefined1 in_stack_ffffffffffffef08 [184];
  undefined8 uVar18;
  vector<double,_std::allocator<double>_> *col_ub_00;
  vector<int,_std::allocator<int>_> *Ap_00;
  vector<int,_std::allocator<int>_> *Ai_00;
  vector<double,_std::allocator<double>_> *Ax;
  vector<double,_std::allocator<double>_> *rhs_00;
  HighsLogOptions *pHVar19;
  Int num_row;
  Int num_col;
  HighsBasis *local_1000;
  HighsModelStatus *local_ff8;
  HighsInfo *local_ff0;
  vector<char,_std::allocator<char>_> constraint_type;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> slack;
  vector<double,_std::allocator<double>_> x;
  double offset;
  vector<double,_std::allocator<double>_> Av;
  vector<double,_std::allocator<double>_> col_ub;
  vector<double,_std::allocator<double>_> col_lb;
  vector<int,_std::allocator<int>_> Ai;
  vector<int,_std::allocator<int>_> Ap;
  vector<double,_std::allocator<double>_> objective;
  IpxSolution ipx_solution;
  Info ipx_info;
  LpSolver lps;
  uint local_120 [2];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100;
  undefined8 local_fc;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  int local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  HighsLogOptions *local_38;
  
  bVar14 = 0;
  Ap_00 = &Ap;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Ai_00 = &Ai;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_ub_00 = &col_ub;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Ax = &Av;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  rhs_00 = &rhs;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar18 = 0x32bc11;
  local_1000 = highs_basis;
  local_ff8 = model_status;
  local_ff0 = highs_info;
  fillInIpxData(lp,&num_col,&num_row,&offset,&objective,&col_lb,col_ub_00,Ap_00,Ai_00,Ax,rhs_00,
                &constraint_type);
  bVar3 = (options->super_HighsOptionsStruct).output_flag;
  iVar12 = (options->super_HighsOptionsStruct).log_dev_level;
  local_78 = 4;
  if (iVar12 != 3) {
    local_78 = (uint)(iVar12 == 1) * 2;
  }
  ipx::Control::Control(&lps.control_);
  memset(&lps.info_,0,0x1d0);
  ipx::Model::Model(&lps.model_);
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  pHVar19 = (HighsLogOptions *)0x32bc83;
  memset(&lps.iterate_,0,200);
  local_120[0] = (uint)bVar3;
  local_118 = 0;
  local_110 = 0x4014000000000000;
  uStack_108 = 0xbff0000000000000;
  local_100 = 0;
  local_fc = 0x1ffffffff;
  local_f4 = 300;
  local_f0 = 0x3eb0c6f7a0b5ed8d;
  uStack_e8 = 0x3e45798ee2308c3a;
  local_e0 = 0x3e112e0be826d695;
  uStack_d8 = 0x3e112e0be826d695;
  local_d0 = 0x3fd3333333333333;
  local_c8 = 1;
  local_c0 = 0x3eb0c6f7a0b5ed8d;
  uStack_b8 = 0x4000000000000000;
  local_b0 = 0xa00002710;
  local_a8 = 0;
  local_a0 = 0x3fb0000000000000;
  local_98 = 1;
  local_90 = 0x3e45798ee2308c3a;
  uStack_88 = 0x3e7ad7f29abcaf48;
  local_80 = 0x3e7ad7f29abcaf48;
  local_74 = 0xffffffff;
  uStack_6c = 0xffffffff00000001;
  local_64 = 0x500000000;
  local_58 = 0x4059000000000000;
  uStack_50 = 0x3ff8000000000000;
  local_48 = 0x3fe0000000000000;
  local_40 = 3;
  local_3c = 1;
  local_38 = log_options_;
  puVar10 = local_120;
  puVar11 = (undefined8 *)&stack0xffffffffffffef08;
  for (lVar9 = 0x1e; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar11 = *(undefined8 *)puVar10;
    puVar10 = puVar10 + ((ulong)bVar14 * -2 + 1) * 2;
    puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
  }
  new_parameters.super_ipx_parameters.maxpasses = (int)uVar18;
  new_parameters.super_ipx_parameters.run_centring = (int)((ulong)uVar18 >> 0x20);
  new_parameters.super_ipx_parameters.display = in_stack_ffffffffffffef08._0_4_;
  new_parameters.super_ipx_parameters._4_4_ = in_stack_ffffffffffffef08._4_4_;
  new_parameters.super_ipx_parameters.logfile = (char *)in_stack_ffffffffffffef08._8_8_;
  new_parameters.super_ipx_parameters.print_interval = (double)in_stack_ffffffffffffef08._16_8_;
  new_parameters.super_ipx_parameters.time_limit = (double)in_stack_ffffffffffffef08._24_8_;
  new_parameters.super_ipx_parameters.analyse_basis_data = (bool)in_stack_ffffffffffffef08[0x20];
  new_parameters.super_ipx_parameters._33_3_ = in_stack_ffffffffffffef08._33_3_;
  new_parameters.super_ipx_parameters.dualize = in_stack_ffffffffffffef08._36_4_;
  new_parameters.super_ipx_parameters.scale = in_stack_ffffffffffffef08._40_4_;
  new_parameters.super_ipx_parameters.ipm_maxiter = in_stack_ffffffffffffef08._44_4_;
  new_parameters.super_ipx_parameters.ipm_feasibility_tol = (double)in_stack_ffffffffffffef08._48_8_
  ;
  new_parameters.super_ipx_parameters.ipm_optimality_tol = (double)in_stack_ffffffffffffef08._56_8_;
  new_parameters.super_ipx_parameters.ipm_drop_primal = (double)in_stack_ffffffffffffef08._64_8_;
  new_parameters.super_ipx_parameters.ipm_drop_dual = (double)in_stack_ffffffffffffef08._72_8_;
  new_parameters.super_ipx_parameters.kkt_tol = (double)in_stack_ffffffffffffef08._80_8_;
  new_parameters.super_ipx_parameters.crash_basis = in_stack_ffffffffffffef08._88_4_;
  new_parameters.super_ipx_parameters._92_4_ = in_stack_ffffffffffffef08._92_4_;
  new_parameters.super_ipx_parameters.dependency_tol = (double)in_stack_ffffffffffffef08._96_8_;
  new_parameters.super_ipx_parameters.volume_tol = (double)in_stack_ffffffffffffef08._104_8_;
  new_parameters.super_ipx_parameters.rows_per_slice = in_stack_ffffffffffffef08._112_4_;
  new_parameters.super_ipx_parameters.maxskip_updates = in_stack_ffffffffffffef08._116_4_;
  new_parameters.super_ipx_parameters.lu_kernel = in_stack_ffffffffffffef08._120_4_;
  new_parameters.super_ipx_parameters._124_4_ = in_stack_ffffffffffffef08._124_4_;
  new_parameters.super_ipx_parameters.lu_pivottol = (double)in_stack_ffffffffffffef08._128_8_;
  new_parameters.super_ipx_parameters.run_crossover = in_stack_ffffffffffffef08._136_4_;
  new_parameters.super_ipx_parameters._140_4_ = in_stack_ffffffffffffef08._140_4_;
  new_parameters.super_ipx_parameters.start_crossover_tol =
       (double)in_stack_ffffffffffffef08._144_8_;
  new_parameters.super_ipx_parameters.pfeasibility_tol = (double)in_stack_ffffffffffffef08._152_8_;
  new_parameters.super_ipx_parameters.dfeasibility_tol = (double)in_stack_ffffffffffffef08._160_8_;
  new_parameters.super_ipx_parameters.debug = in_stack_ffffffffffffef08._168_4_;
  new_parameters.super_ipx_parameters.switchiter = in_stack_ffffffffffffef08._172_4_;
  new_parameters.super_ipx_parameters.stop_at_switch = in_stack_ffffffffffffef08._176_4_;
  new_parameters.super_ipx_parameters.update_heuristic = in_stack_ffffffffffffef08._180_4_;
  new_parameters.super_ipx_parameters._192_8_ = col_ub_00;
  new_parameters.super_ipx_parameters.centring_ratio_tolerance = (double)Ap_00;
  new_parameters.super_ipx_parameters.centring_ratio_reduction = (double)Ai_00;
  new_parameters.super_ipx_parameters.centring_alpha_scaling = (double)Ax;
  new_parameters.super_ipx_parameters._224_8_ = rhs_00;
  new_parameters.super_ipx_parameters.log_options = pHVar19;
  ipx::LpSolver::SetParameters(&lps,new_parameters);
  ipx::LpSolver::SetCallback(&lps,highs_callback);
  IVar6 = ipx::LpSolver::LoadModel
                    (&lps,num_col,offset,
                     objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,num_row,
                     Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (IVar6 == 0) {
    std::vector<double,_std::allocator<double>_>::vector(&x,&highs_solution->col_value);
    if (0 < (long)num_col) {
      lVar9 = 0;
      do {
        dVar17 = col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
        uVar15 = SUB84(dVar17,0);
        uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
        dVar2 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        if (dVar17 <= dVar2) {
          uVar15 = SUB84(dVar2,0);
          uVar16 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] = (double)CONCAT44(uVar16,uVar15);
        dVar17 = col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
        if ((double)CONCAT44(uVar16,uVar15) <= dVar17) {
          dVar17 = (double)CONCAT44(uVar16,uVar15);
        }
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] = dVar17;
        lVar9 = lVar9 + 1;
      } while (num_col != lVar9);
    }
    std::vector<double,_std::allocator<double>_>::vector(&slack,&rhs);
    if (0 < (long)num_col) {
      lVar9 = 0;
      iVar12 = *Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      do {
        iVar5 = Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar9 + 1];
        if (iVar12 < iVar5) {
          lVar13 = (long)iVar12;
          do {
            slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar13]] =
                 slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar13]] -
                 Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13] *
                 x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
            lVar13 = lVar13 + 1;
          } while (iVar5 != lVar13);
        }
        lVar9 = lVar9 + 1;
        iVar12 = iVar5;
      } while (lVar9 != num_col);
    }
    if (0 < (long)num_row) {
      lVar9 = 0;
      do {
        cVar4 = constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        if (cVar4 == '<') {
          uVar15 = 0;
          uVar16 = 0;
          dVar17 = slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
          if (0.0 <= dVar17) {
            uVar15 = SUB84(dVar17,0);
            uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
          }
LAB_0032bf78:
          slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] = (double)CONCAT44(uVar16,uVar15);
        }
        else {
          if (cVar4 == '>') {
            uVar15 = 0;
            uVar16 = 0;
            dVar17 = slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
            if (dVar17 <= 0.0) {
              uVar15 = SUB84(dVar17,0);
              uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
            }
            goto LAB_0032bf78;
          }
          if (cVar4 == '=') {
            slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] = 0.0;
          }
        }
        lVar9 = lVar9 + 1;
      } while (num_row != lVar9);
    }
    if (((highs_solution->dual_valid == false) ||
        (num_col !=
         (int)((ulong)((long)(highs_solution->col_dual).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(highs_solution->col_dual).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3))) ||
       (num_row !=
        (int)((ulong)((long)(highs_solution->row_dual).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(highs_solution->row_dual).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3))) {
      y_start = (double *)0x0;
      highsLogUser(log_options_,kInfo,"Calling IPX crossover with only primal values\n");
      z_start = (double *)0x0;
    }
    else {
      highsLogUser(log_options_,kInfo,"Calling IPX crossover with primal and dual values\n");
      z_start = (highs_solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      y_start = (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    uVar7 = ipx::LpSolver::CrossoverFromStartingPoint
                      (&lps,x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                       slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,y_start,z_start);
    if (uVar7 == 0) {
      ipx::LpSolver::GetInfo(&ipx_info,&lps);
      pHVar1 = &(local_ff0->super_HighsInfoStruct).crossover_iteration_count;
      *pHVar1 = *pHVar1 + ipx_info.super_ipx_info.updates_crossover;
      if (ipx_info.super_ipx_info.status_crossover - 1U < 2) {
        memset(&ipx_solution.ipx_col_value,0,0x90);
        ipx_solution.num_col = num_col;
        ipx_solution.num_row = num_row;
        std::vector<double,_std::allocator<double>_>::resize
                  (&ipx_solution.ipx_col_value,(long)num_col);
        std::vector<double,_std::allocator<double>_>::resize
                  (&ipx_solution.ipx_row_value,(long)num_row);
        std::vector<double,_std::allocator<double>_>::resize
                  (&ipx_solution.ipx_col_dual,(long)num_col);
        std::vector<double,_std::allocator<double>_>::resize
                  (&ipx_solution.ipx_row_dual,(long)num_row);
        std::vector<int,_std::allocator<int>_>::resize(&ipx_solution.ipx_row_status,(long)num_row);
        std::vector<int,_std::allocator<int>_>::resize(&ipx_solution.ipx_col_status,(long)num_col);
        uVar7 = ipx::LpSolver::GetBasicSolution
                          (&lps,ipx_solution.ipx_col_value.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,
                           ipx_solution.ipx_row_value.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           ipx_solution.ipx_row_dual.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           ipx_solution.ipx_col_dual.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           ipx_solution.ipx_row_status.super__Vector_base<int,_std::allocator<int>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           ipx_solution.ipx_col_status.super__Vector_base<int,_std::allocator<int>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (uVar7 == 0) {
          HVar8 = ipxBasicSolutionToHighsBasicSolution
                            (log_options_,lp,&rhs,&constraint_type,&ipx_solution,local_1000,
                             highs_solution);
          if (HVar8 == kOk) {
            HVar8 = (HighsStatus)(ipx_info.super_ipx_info.status_crossover == 2);
            (local_ff0->super_HighsInfoStruct).basis_validity = (uint)local_1000->valid;
            *local_ff8 = (uint)(ipx_info.super_ipx_info.status_crossover == 2) * 8 + kOptimal;
          }
          else {
            HVar8 = kError;
            highsLogUser(log_options_,kError,
                         "Failed to convert IPX basic solution to Highs basic solution\n");
          }
        }
        else {
          HVar8 = kError;
          highsLogUser(log_options_,kError,"IPX crossover getting basic solution: flag = %d\n",
                       (ulong)uVar7);
        }
        if (ipx_solution.ipx_row_status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ipx_solution.ipx_row_status.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (ipx_solution.ipx_col_status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ipx_solution.ipx_col_status.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (ipx_solution.ipx_row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ipx_solution.ipx_row_dual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (ipx_solution.ipx_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ipx_solution.ipx_col_dual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (ipx_solution.ipx_row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ipx_solution.ipx_row_value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (ipx_solution.ipx_col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ipx_solution.ipx_col_value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else if (ipx_info.super_ipx_info.status_crossover == 6) {
        *local_ff8 = kTimeLimit;
        HVar8 = kWarning;
      }
      else {
        HVar8 = kError;
        highsLogUser(log_options_,kError,"IPX crossover failed: status = %d\n",
                     (ulong)(uint)ipx_info.super_ipx_info.status_crossover);
      }
    }
    else {
      HVar8 = kError;
      highsLogUser(log_options_,kError,"IPX crossover error: flag = %d\n",(ulong)uVar7);
    }
    if (slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    HVar8 = kError;
    highsLogUser(log_options_,kError,"Error loading ipx model\n");
  }
  ipx::LpSolver::~LpSolver(&lps);
  if (constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start);
  }
  if (Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start);
  }
  return HVar8;
}

Assistant:

HighsStatus callCrossover(const HighsOptions& options, const HighsLp& lp,
                          HighsBasis& highs_basis,
                          HighsSolution& highs_solution,
                          HighsModelStatus& model_status, HighsInfo& highs_info,
                          HighsCallback& highs_callback) {
  ipx::Int num_col, num_row;
  double offset;
  std::vector<ipx::Int> Ap, Ai;
  std::vector<double> objective, col_lb, col_ub, Av, rhs;
  std::vector<char> constraint_type;

  fillInIpxData(lp, num_col, num_row, offset, objective, col_lb, col_ub, Ap, Ai,
                Av, rhs, constraint_type);
  // if (res != IpxStatus::OK) return HighsStatus::kError;

  const HighsLogOptions& log_options = options.log_options;

  ipx::Parameters parameters;
  parameters.run_crossover = 1;  // 1 = "on"
  parameters.crash_basis = 1;    // 0 = slack basis; 1 = crash basis
  parameters.display = 1;
  if (!options.output_flag) parameters.display = 0;
  // Modify parameters.debug according to log_dev_level
  parameters.debug = 0;
  if (options.log_dev_level == kHighsLogDevLevelDetailed) {
    // Default options.log_dev_level setting is kHighsLogDevLevelNone, yielding
    // default setting debug = 0
  } else if (options.log_dev_level == kHighsLogDevLevelInfo) {
    parameters.debug = 2;
  } else if (options.log_dev_level == kHighsLogDevLevelVerbose) {
    parameters.debug = 4;
  }
  parameters.highs_logging = true;
  parameters.log_options = &options.log_options;

  ipx::LpSolver lps;
  lps.SetParameters(parameters);

  // Set pointer to any callback
  lps.SetCallback(&highs_callback);

  ipx::Int load_status = lps.LoadModel(
      num_col, offset, objective.data(), col_lb.data(), col_ub.data(), num_row,
      Ap.data(), Ai.data(), Av.data(), rhs.data(), constraint_type.data());
  if (load_status != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Error loading ipx model\n");
    return HighsStatus::kError;
  }

  // Set x values within bounds.
  std::vector<double> x(highs_solution.col_value);
  for (int i = 0; i < num_col; i++) {
    x[i] = std::max(x[i], col_lb[i]);
    x[i] = std::min(x[i], col_ub[i]);
  }

  // Build slack variables from rhs-A*x but subject to sign conditions.
  std::vector<double> slack(rhs);
  for (int i = 0; i < num_col; i++) {
    for (int p = Ap[i]; p < Ap[i + 1]; ++p) slack[Ai[p]] -= Av[p] * x[i];
  }
  for (int i = 0; i < num_row; i++) {
    switch (constraint_type[i]) {
      case '=':
        slack[i] = 0.0;
        break;
      case '<':
        slack[i] = std::max(slack[i], 0.0);
        break;
      case '>':
        slack[i] = std::min(slack[i], 0.0);
        break;
    }
  }
  ipx::Int crossover_status;
  if (highs_solution.dual_valid &&
      (HighsInt)highs_solution.col_dual.size() == num_col &&
      (HighsInt)highs_solution.row_dual.size() == num_row) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Calling IPX crossover with primal and dual values\n");
    crossover_status = lps.CrossoverFromStartingPoint(
        x.data(), slack.data(), highs_solution.row_dual.data(),
        highs_solution.col_dual.data());
  } else {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Calling IPX crossover with only primal values\n");
    crossover_status = lps.CrossoverFromStartingPoint(x.data(), slack.data(),
                                                      nullptr, nullptr);
  }

  if (crossover_status != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover error: flag = %d\n", (int)crossover_status);
    return HighsStatus::kError;
  }
  ipx::Info ipx_info = lps.GetInfo();
  highs_info.crossover_iteration_count += (HighsInt)ipx_info.updates_crossover;
  const bool imprecise_solution =
      ipx_info.status_crossover == IPX_STATUS_imprecise;
  if (ipx_info.status_crossover != IPX_STATUS_optimal &&
      ipx_info.status_crossover != IPX_STATUS_imprecise &&
      ipx_info.status_crossover != IPX_STATUS_time_limit) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover failed: status = %d\n",
                 (int)ipx_info.status_crossover);
    return HighsStatus::kError;
  }
  if (ipx_info.status_crossover == IPX_STATUS_time_limit) {
    model_status = HighsModelStatus::kTimeLimit;
    return HighsStatus::kWarning;
  }

  // Get basis
  IpxSolution ipx_solution;
  ipx_solution.num_col = num_col;
  ipx_solution.num_row = num_row;
  ipx_solution.ipx_col_value.resize(num_col);
  ipx_solution.ipx_row_value.resize(num_row);
  ipx_solution.ipx_col_dual.resize(num_col);
  ipx_solution.ipx_row_dual.resize(num_row);
  ipx_solution.ipx_row_status.resize(num_row);
  ipx_solution.ipx_col_status.resize(num_col);
  ipx::Int errflag = lps.GetBasicSolution(
      ipx_solution.ipx_col_value.data(), ipx_solution.ipx_row_value.data(),
      ipx_solution.ipx_row_dual.data(), ipx_solution.ipx_col_dual.data(),
      ipx_solution.ipx_row_status.data(), ipx_solution.ipx_col_status.data());
  if (errflag != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover getting basic solution: flag = %d\n",
                 (int)errflag);
    return HighsStatus::kError;
  }

  // Convert the IPX basic solution to a HiGHS basic solution
  HighsStatus status = ipxBasicSolutionToHighsBasicSolution(
      options.log_options, lp, rhs, constraint_type, ipx_solution, highs_basis,
      highs_solution);

  if (status != HighsStatus::kOk) {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Failed to convert IPX basic solution to Highs basic solution\n");
    return HighsStatus::kError;
  }
  highs_info.basis_validity =
      highs_basis.valid ? kBasisValidityValid : kBasisValidityInvalid;
  HighsStatus return_status;
  if (imprecise_solution) {
    model_status = HighsModelStatus::kUnknown;
    return_status = HighsStatus::kWarning;
  } else {
    model_status = HighsModelStatus::kOptimal;
    return_status = HighsStatus::kOk;
  }
  return return_status;
}